

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O0

Vec_Ptr_t * Abc_NtkComputeSupportsNaive(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pObj_00;
  void *pvVar2;
  int local_40;
  int local_3c;
  int k;
  int i;
  Abc_Obj_t *pTemp;
  Abc_Obj_t *pObj;
  Vec_Int_t *vSuppI;
  Vec_Ptr_t *vSupports;
  Vec_Ptr_t *vSupp;
  Abc_Ntk_t *pNtk_local;
  
  vSupp = (Vec_Ptr_t *)pNtk;
  for (local_3c = 0; iVar1 = Abc_NtkCiNum((Abc_Ntk_t *)vSupp), local_3c < iVar1;
      local_3c = local_3c + 1) {
    pTemp = Abc_NtkCi((Abc_Ntk_t *)vSupp,local_3c);
    pTemp->pNext = (Abc_Obj_t *)(long)local_3c;
  }
  iVar1 = Abc_NtkCoNum((Abc_Ntk_t *)vSupp);
  vSuppI = (Vec_Int_t *)Vec_PtrAlloc(iVar1);
  for (local_3c = 0; iVar1 = Abc_NtkCoNum((Abc_Ntk_t *)vSupp), local_3c < iVar1;
      local_3c = local_3c + 1) {
    pTemp = Abc_NtkCo((Abc_Ntk_t *)vSupp,local_3c);
    pObj_00 = Abc_ObjFanin0(pTemp);
    iVar1 = Abc_ObjIsNode(pObj_00);
    if (iVar1 != 0) {
      pObj = (Abc_Obj_t *)Abc_NtkNodeSupport((Abc_Ntk_t *)vSupp,&pTemp,1);
      vSupports = (Vec_Ptr_t *)pObj;
      for (local_40 = 0; iVar1 = Vec_PtrSize(vSupports), local_40 < iVar1; local_40 = local_40 + 1)
      {
        pvVar2 = Vec_PtrEntry(vSupports,local_40);
        Vec_IntWriteEntry((Vec_Int_t *)pObj,local_40,(int)*(undefined8 *)((long)pvVar2 + 8));
      }
      Vec_IntSort((Vec_Int_t *)pObj,0);
      Vec_IntPush((Vec_Int_t *)pObj,local_3c);
      Vec_PtrPush((Vec_Ptr_t *)vSuppI,pObj);
    }
  }
  for (local_3c = 0; iVar1 = Abc_NtkCiNum((Abc_Ntk_t *)vSupp), local_3c < iVar1;
      local_3c = local_3c + 1) {
    pTemp = Abc_NtkCi((Abc_Ntk_t *)vSupp,local_3c);
    pTemp->pNext = (Abc_Obj_t *)0x0;
  }
  Vec_VecSort((Vec_Vec_t *)vSuppI,1);
  return (Vec_Ptr_t *)vSuppI;
}

Assistant:

Vec_Ptr_t * Abc_NtkComputeSupportsNaive( Abc_Ntk_t * pNtk )
{
    Vec_Ptr_t * vSupp, * vSupports;
    Vec_Int_t * vSuppI;
    Abc_Obj_t * pObj, * pTemp;
    int i, k;
    // set the PI numbers
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)(ABC_PTRINT_T)i;
    // save the CI numbers
    vSupports = Vec_PtrAlloc( Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        if ( !Abc_ObjIsNode(Abc_ObjFanin0(pObj)) )
            continue;
        vSupp = Abc_NtkNodeSupport( pNtk, &pObj, 1 );
        vSuppI = (Vec_Int_t *)vSupp;
        Vec_PtrForEachEntry( Abc_Obj_t *, vSupp, pTemp, k )
            Vec_IntWriteEntry( vSuppI, k, (int)(ABC_PTRINT_T)pTemp->pNext );
        Vec_IntSort( vSuppI, 0 );
        // append the number of this output
        Vec_IntPush( vSuppI, i );
        // save the support in the vector
        Vec_PtrPush( vSupports, vSuppI );
    }
    // clean the CI numbers
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = NULL;
    // sort supports by size
    Vec_VecSort( (Vec_Vec_t *)vSupports, 1 );
/*
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vSuppI, i )
        printf( "%d ", Vec_IntSize(vSuppI) );
    printf( "\n" );
*/
    return vSupports;
}